

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::ParameterSymbol*>::
emplace_back<slang::ast::ParameterSymbol*const&>
          (SmallVectorBase<slang::ast::ParameterSymbol_*> *this,ParameterSymbol **args)

{
  iterator ppPVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::ast::ParameterSymbol_*> *in_RDI;
  ParameterSymbol **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::ParameterSymbol_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<slang::ast::ParameterSymbol_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::ParameterSymbol*const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppPVar1 = SmallVectorBase<slang::ast::ParameterSymbol_*>::end(in_RDI);
    *ppPVar1 = (ParameterSymbol *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<slang::ast::ParameterSymbol_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }